

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printProblem.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  long *plVar1;
  ostream *poVar2;
  Arguments args;
  long *local_270;
  long local_268;
  long local_260 [2];
  Arguments local_250;
  
  ArgumentHandlers::Arguments::Arguments(&local_250);
  argp_parse(ArgumentHandlers::theArgpStruc,argc,argv,0,0,&local_250);
  plVar1 = (long *)ArgumentUtils::GetDecPOMDPDiscreteInterfaceFromArgs(&local_250);
  (**(code **)(*(long *)((long)plVar1 + *(long *)(*plVar1 + -0xb8)) + 0x170))
            (&local_270,(long)plVar1 + *(long *)(*plVar1 + -0xb8));
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_270,local_268);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  if (local_270 != local_260) {
    operator_delete(local_270,local_260[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250.maxplus_updateT._M_dataplus._M_p != &local_250.maxplus_updateT.field_2) {
    operator_delete(local_250.maxplus_updateT._M_dataplus._M_p,
                    local_250.maxplus_updateT.field_2._M_allocated_capacity + 1);
  }
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
    try
    {

    ArgumentHandlers::Arguments args;

    argp_parse (&ArgumentHandlers::theArgpStruc, argc, argv, 0, 0, &args);

    DecPOMDPDiscreteInterface* dpomdp = GetDecPOMDPDiscreteInterfaceFromArgs(args);
    cout << dpomdp->SoftPrint() << endl;

    }
    catch(E& e){ e.Print(); }

    return(0);
}